

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O1

PyObject * libxml_xmlFreeTextReader(PyObject *self,PyObject *args)

{
  long *plVar1;
  int iVar2;
  long lVar3;
  PyObject *pPVar4;
  xmlTextReaderErrorFunc f;
  PyObject *pyobj_reader;
  void *arg;
  code *local_28;
  undefined *local_20;
  undefined8 *local_18;
  
  pPVar4 = (PyObject *)0x0;
  iVar2 = _PyArg_ParseTuple_SizeT(args,"O:xmlFreeTextReader",&local_20);
  if (iVar2 != 0) {
    if (*(undefined **)(local_20 + 8) == &PyCapsule_Type) {
      if (local_20 == &_Py_NoneStruct) {
        lVar3 = 0;
      }
      else {
        lVar3 = *(long *)(local_20 + 0x10);
      }
      if (lVar3 != 0) {
        xmlTextReaderGetErrorHandler(lVar3,&local_28,&local_18);
        if ((local_18 != (undefined8 *)0x0) && (local_28 == libxml_xmlTextReaderErrorCallback)) {
          plVar1 = (long *)*local_18;
          if ((plVar1 != (long *)0x0) && (*plVar1 = *plVar1 + -1, *plVar1 == 0)) {
            _Py_Dealloc();
          }
          plVar1 = (long *)local_18[1];
          if ((plVar1 != (long *)0x0) && (*plVar1 = *plVar1 + -1, *plVar1 == 0)) {
            _Py_Dealloc();
          }
          (*_xmlFree)(local_18);
        }
        xmlFreeTextReader(lVar3);
      }
    }
    pPVar4 = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  return pPVar4;
}

Assistant:

static PyObject *
libxml_xmlFreeTextReader(ATTRIBUTE_UNUSED PyObject *self, PyObject *args) {
    xmlTextReaderPtr reader;
    PyObject *pyobj_reader;
    xmlTextReaderPyCtxtPtr pyCtxt;
    xmlTextReaderErrorFunc f;
    void *arg;

    if (!PyArg_ParseTuple(args, (char *)"O:xmlFreeTextReader", &pyobj_reader))
        return(NULL);
    if (!PyCapsule_CheckExact(pyobj_reader)) {
	Py_INCREF(Py_None);
	return(Py_None);
    }
    reader = (xmlTextReaderPtr) PyxmlTextReader_Get(pyobj_reader);
    if (reader == NULL) {
	Py_INCREF(Py_None);
	return(Py_None);
    }

    xmlTextReaderGetErrorHandler(reader,&f,&arg);
    if (arg != NULL) {
	if (f == (xmlTextReaderErrorFunc) libxml_xmlTextReaderErrorCallback) {
	    /* ok, it's our error handler! */
	    pyCtxt = (xmlTextReaderPyCtxtPtr)arg;
	    Py_XDECREF(pyCtxt->f);
	    Py_XDECREF(pyCtxt->arg);
	    xmlFree(pyCtxt);
	}
	/* 
	 * else, something wrong happened, because the error handler is
	 * not owned by the python bindings...
	 */
    }

    xmlFreeTextReader(reader);
    Py_INCREF(Py_None);
    return(Py_None);
}